

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O2

ssize_t __thiscall
nuraft::FakeClient::send(FakeClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SimpleLogger *this_00;
  ssize_t extraout_RAX;
  msg_type type;
  undefined4 in_register_00000034;
  ReqPkg local_a0;
  string local_70;
  undefined8 local_50 [4];
  
  this_00 = ((this->motherNet->base).
             super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->myLog;
  if ((this_00 != (SimpleLogger *)0x0) && (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)
     ) {
    std::__cxx11::string::string((string *)&local_a0,(string *)&this->motherNet->myEndpoint);
    std::__cxx11::string::string((string *)local_50,(string *)&this->dstNet->myEndpoint);
    msg_type_to_string_abi_cxx11_
              (&local_70,
               (nuraft *)
               (ulong)(((((ptr<req_msg> *)CONCAT44(in_register_00000034,__fd))->
                        super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      super_msg_base).type_,type);
    SimpleLogger::put(this_00,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                      ,"send",0x135,"got request %s -> %s, %s",
                      local_a0.req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,local_50[0],local_70._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  FakeNetwork::ReqPkg::ReqPkg
            (&local_a0,(ptr<req_msg> *)CONCAT44(in_register_00000034,__fd),(rpc_handler *)__buf);
  std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>::
  push_back(&this->pendingReqs,&local_a0);
  FakeNetwork::ReqPkg::~ReqPkg(&local_a0);
  return extraout_RAX;
}

Assistant:

void FakeClient::send(ptr<req_msg>& req,
                      rpc_handler& when_done,
                      uint64_t /*send_timeout_ms*/)
{
    SimpleLogger* ll = motherNet->getBase()->getLogger();
    _log_info(ll, "got request %s -> %s, %s",
              motherNet->getEndpoint().c_str(),
              dstNet->getEndpoint().c_str(),
              msg_type_to_string( req->get_type() ).c_str() );
    pendingReqs.push_back( FakeNetwork::ReqPkg(req, when_done) );
}